

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

TimingControlStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingControlStatementSyntax,slang::syntax::TimingControlStatementSyntax_const&>
          (BumpAllocator *this,TimingControlStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  StatementSyntax *pSVar3;
  undefined4 uVar4;
  TimingControlStatementSyntax *pTVar5;
  
  pTVar5 = (TimingControlStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TimingControlStatementSyntax *)this->endPtr < pTVar5 + 1) {
    pTVar5 = (TimingControlStatementSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pTVar5 + 1);
  }
  (pTVar5->super_StatementSyntax).super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_StatementSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StatementSyntax).super_SyntaxNode.parent;
  (pTVar5->super_StatementSyntax).super_SyntaxNode.kind =
       (args->super_StatementSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pTVar5->super_StatementSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pTVar5->super_StatementSyntax).super_SyntaxNode.parent = pSVar1;
  (pTVar5->super_StatementSyntax).label = (args->super_StatementSyntax).label;
  (pTVar5->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)
           &(args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pTVar5->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pTVar5->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar4;
  (pTVar5->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pTVar5->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006d0438;
  (pTVar5->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_StatementSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_StatementSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pTVar5->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_StatementSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pTVar5->super_StatementSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pTVar5->super_StatementSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006d0388;
  pSVar3 = (args->statement).ptr;
  (pTVar5->timingControl).ptr = (args->timingControl).ptr;
  (pTVar5->statement).ptr = pSVar3;
  return pTVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }